

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatements
          (cmNinjaTargetGenerator *this,string *config,string *fileConfig,bool firstForConfig)

{
  pointer *pppcVar1;
  _Rb_tree_node_base *lang;
  pointer pcVar2;
  iterator __position;
  cmOSXBundleGenerator *pcVar3;
  cmMakefile *this_00;
  cmSourceFile *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  pointer ppcVar6;
  long lVar7;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  undefined8 uVar8;
  pointer pbVar9;
  pointer pbVar10;
  int iVar11;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar13;
  ostream *poVar14;
  mapped_type *pmVar15;
  cmValue cVar16;
  cmGlobalNinjaGenerator *pcVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar19;
  MapToNinjaPathImpl MVar20;
  ulong uVar21;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *__x;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var22;
  undefined4 extraout_var_03;
  pointer ppcVar23;
  cmCustomCommand *pcVar24;
  pointer ppcVar25;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string tgtDir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  cmCustomCommand *cc;
  key_type *fileConfig_00;
  string *fileConfig_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *this_02;
  string local_3d8;
  _Rb_tree_node_base *local_3b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3b0;
  bool local_390;
  string local_388;
  undefined1 local_368 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_350;
  _Alloc_hider local_340;
  undefined1 local_338 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_328 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0 [2];
  cmNinjaDeps local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [5];
  string local_208;
  string local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  code *local_188;
  undefined8 uStack_180;
  __node_base local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  _Hash_node_base local_168 [2];
  undefined1 local_158 [184];
  cmNinjaDeps local_a0;
  _Rb_tree_node_base local_80;
  size_t local_60;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  cmGeneratorTarget::CheckCxxModuleStatus
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar11 = (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x41])(pcVar12,fileConfig);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)CONCAT44(extraout_var,iVar11));
  pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar11 = (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x41])(pcVar12,fileConfig);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var_00,iVar11),"# Object build statements for ",0x1e);
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  psVar13 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)CONCAT44(extraout_var_00,iVar11),(psVar13->_M_dataplus)._M_p,
                       psVar13->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," target ",8);
  psVar13 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_368._0_8_ = local_368 + 0x10;
  pcVar2 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_368,pcVar2,pcVar2 + psVar13->_M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(char *)local_368._0_8_,local_368._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n\n",2);
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
  }
  local_368._0_8_ = (pointer)0x0;
  local_368._8_8_ = (pointer)0x0;
  local_368._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_368,config
            );
  uVar8 = local_368._8_8_;
  if (local_368._0_8_ != local_368._8_8_) {
    ppcVar23 = (pointer)local_368._0_8_;
    do {
      local_158._0_8_ = cmSourceFile::GetCustomCommand(*ppcVar23);
      cmLocalNinjaGenerator::AddCustomCommandTarget
                (this->LocalGenerator,(cmCustomCommand *)local_158._0_8_,
                 (this->super_cmCommonTargetGenerator).GeneratorTarget);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                ::operator[](&this->Configs,config);
      __position._M_current =
           (pmVar15->CustomCommands).
           super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pmVar15->CustomCommands).
          super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>>::
        _M_realloc_insert<cmCustomCommand_const*const&>
                  ((vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>> *)
                   &pmVar15->CustomCommands,__position,(cmCustomCommand **)local_158);
      }
      else {
        *__position._M_current = (cmCustomCommand *)local_158._0_8_;
        pppcVar1 = &(pmVar15->CustomCommands).
                    super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      ppcVar23 = ppcVar23 + 1;
    } while (ppcVar23 != (pointer)uVar8);
  }
  if ((pointer)local_368._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ - local_368._0_8_);
  }
  local_368._0_8_ = (pointer)0x0;
  local_368._8_8_ = (pointer)0x0;
  local_368._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_368,config
            );
  pcVar3 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  this_02 = &this->Configs;
  fileConfig_00 = fileConfig;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_02,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar3,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_368
             ,&((pmVar15->MacOSXContentGenerator)._M_t.
                super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
               _M_head_impl)->super_MacOSXContentGeneratorType,config);
  if ((pointer)local_368._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ - local_368._0_8_);
  }
  local_368._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_368._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_368._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_368,config
            );
  pcVar3 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_02,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar3,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_368
             ,&((pmVar15->MacOSXContentGenerator)._M_t.
                super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
                .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
               _M_head_impl)->super_MacOSXContentGeneratorType,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ - local_368._0_8_);
  }
  if (firstForConfig) {
    this_00 = (this->super_cmCommonTargetGenerator).Makefile;
    local_368._0_8_ = local_368 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"CMAKE_PCH_EXTENSION","");
    cVar16 = cmMakefile::GetDefinition(this_00,(string *)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_368 + 0x10)) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    local_158._0_8_ = (cmCustomCommand *)0x0;
    local_158._8_8_ = (cmCustomCommand *)0x0;
    local_158._16_8_ = (pointer)0x0;
    cmGeneratorTarget::GetExternalObjects
              ((this->super_cmCommonTargetGenerator).GeneratorTarget,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_158,
               config);
    uVar8 = local_158._8_8_;
    for (pcVar24 = (cmCustomCommand *)local_158._0_8_; pcVar24 != (cmCustomCommand *)uVar8;
        pcVar24 = (cmCustomCommand *)
                  &(pcVar24->Outputs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (cmSourceFile *)
                (pcVar24->Outputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
      pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar13 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar17,psVar13);
      (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x16])(local_368,pcVar12,psVar13,config);
      local_1e8._M_dataplus._M_p = (pointer)local_368._8_8_;
      local_1e8._M_string_length = local_368._0_8_;
      if (cVar16.Value == (string *)0x0) {
LAB_00283061:
        pmVar15 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                  ::operator[](this_02,config);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar15->Objects,(value_type *)local_368);
      }
      else {
        __n1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(cVar16.Value)->_M_string_length;
        if (((ulong)local_368._8_8_ < __n1) ||
           (__str._M_str = ((cVar16.Value)->_M_dataplus)._M_p, __str._M_len = (size_t)__n1,
           iVar11 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_1e8,
                               local_368._8_8_ - (long)__n1,(size_type)__n1,__str), iVar11 != 0))
        goto LAB_00283061;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_368 + 0x10)) {
        operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
      }
    }
    if ((cmCustomCommand *)local_158._0_8_ != (cmCustomCommand *)0x0) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
    }
  }
  local_1b8._M_allocated_capacity = (size_type)&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"phony","");
  local_158._0_8_ = local_158 + 0x10;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
  local_158._32_8_ = local_158 + 0x30;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_1b8._M_allocated_capacity == &local_1a8) {
    local_158._56_8_ = local_1a8._M_string_length;
  }
  else {
    local_158._32_8_ = local_1b8._M_allocated_capacity;
  }
  local_158._40_8_ = local_1b8._8_8_;
  local_1b8._8_8_ = 0;
  local_1a8._M_dataplus._M_p._0_1_ = 0;
  local_80._M_color = _S_red;
  local_80._M_parent = (_Base_ptr)0x0;
  local_1b8._M_allocated_capacity = (size_type)&local_1a8;
  memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_158 + 0x40),0,
         0x90);
  local_60 = 0;
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_80._M_left = &local_80;
  local_80._M_right = &local_80;
  psVar13 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  pcVar2 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,pcVar2,pcVar2 + psVar13->_M_string_length);
  local_368._0_8_ = (pointer)0x1c;
  local_368._8_8_ = "Order-only phony target for ";
  local_368._16_8_ = local_3d8._M_string_length;
  aStack_350._0_8_ = local_3d8._M_dataplus._M_p;
  views._M_len = 2;
  views._M_array = (iterator)local_368;
  cmCatViews_abi_cxx11_(&local_1e8,views);
  psVar13 = fileConfig_00;
  std::__cxx11::string::operator=((string *)local_158,(string *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
            (local_368,pcVar12,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_158 + 0x40)
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,&local_a0,
             config,fileConfig_00,DependOnTargetOrdering);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_02,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a0,
             local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pmVar15->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pmVar15->ExtraFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_02,config);
  ppcVar25 = (pmVar15->CustomCommands).
             super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_3b8 = (_Rb_tree_node_base *)
              (pmVar15->CustomCommands).
              super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if ((_Rb_tree_node_base *)ppcVar25 != local_3b8) {
    do {
      pcVar24 = *ppcVar25;
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      pcVar2 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_388,pcVar2,pcVar2 + config->_M_string_length);
      local_390 = false;
      local_1a8.field_2._M_allocated_capacity = 0;
      local_1a8.field_2._8_8_ = 0;
      local_188 = (code *)0x0;
      uStack_180 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = config;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object =
           &local_1a8.field_2;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)psVar13;
      computeInternalDepfile._M_invoker = (_Invoker_type)this_02;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_368,pcVar24,&local_388,
                 (cmLocalGenerator *)this->LocalGenerator,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,computeInternalDepfile);
      if (local_188 != (code *)0x0) {
        (*local_188)(&local_1a8.field_2,&local_1a8.field_2,3);
      }
      if ((local_390 == true) &&
         (local_390 = false,
         local_3b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3b0._M_value + 0x10))) {
        operator_delete((void *)local_3b0._M_value._M_dataplus._M_p,local_3b0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      pvVar18 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_368);
      pvVar19 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_368);
      _Var4._M_current =
           (pvVar18->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar18->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar20.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&local_a0,MVar20);
      _Var4._M_current =
           (pvVar19->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (pvVar19->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar20.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var4,_Var5,&local_a0,MVar20);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_368);
      ppcVar25 = ppcVar25 + 1;
    } while ((_Rb_tree_node_base *)ppcVar25 != local_3b8);
  }
  pbVar10 = local_a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = local_a0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fileConfig_01 = psVar13;
  if (local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar21 = (long)local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar7 = 0x3f;
    if (uVar21 != 0) {
      for (; uVar21 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar9,pbVar10);
  }
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_a0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_a0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_a0,(iterator)__first._M_current,
             (iterator)
             local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar13 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)this->LocalGenerator);
    ppcVar23 = (pointer)(psVar13->_M_dataplus)._M_p;
    ppcVar6 = (pointer)psVar13->_M_string_length;
    local_1e8._M_dataplus._M_p = &DAT_00000001;
    local_1e8._M_string_length = (size_type)&local_1e8.field_2;
    local_1e8.field_2._M_local_buf[0] = '/';
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xe])
              (&local_178,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    local_368._16_8_ = local_1e8._M_dataplus._M_p;
    aStack_350._0_8_ = local_1e8._M_string_length;
    aStack_350._8_8_ = local_170;
    local_340._M_p = (pointer)local_178._M_nxt;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_368;
    psVar13 = fileConfig_01;
    local_368._0_8_ = ppcVar6;
    local_368._8_8_ = ppcVar23;
    cmCatViews_abi_cxx11_(&local_3d8,views_00);
    fileConfig_01 = psVar13;
    if (local_178._M_nxt != local_168) {
      operator_delete(local_178._M_nxt,(ulong)((long)&(local_168[0]._M_nxt)->_M_nxt + 1));
    }
    pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    __x = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar12,&local_3d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_a0,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar11 = (*(pcVar17->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x41])(pcVar17,psVar13);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar12,(ostream *)CONCAT44(extraout_var_01,iVar11),(cmNinjaBuild *)local_158,0,
             (bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_158);
  local_368._0_8_ = (pointer)0x0;
  local_368._8_8_ = (pointer)0x0;
  local_368._16_8_ = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_368,config
            );
  uVar8 = local_368._8_8_;
  for (ppcVar23 = (pointer)local_368._0_8_; ppcVar23 != (pointer)uVar8; ppcVar23 = ppcVar23 + 1) {
    WriteObjectBuildStatement(this,*ppcVar23,config,fileConfig_01,firstForConfig);
  }
  if ((pointer)local_368._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ - local_368._0_8_);
  }
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_02,config);
  p_Var22 = (pmVar15->DDIFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3b8 = &(pmVar15->DDIFiles)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var22 != local_3b8) {
    do {
      lang = p_Var22 + 1;
      LanguageDyndepRule(&local_208,this,(string *)lang,config);
      local_368._0_8_ = local_368 + 0x10;
      local_368._8_8_ = (pointer)0x0;
      local_368._16_8_ = local_368._16_8_ & 0xffffffffffffff00;
      aStack_350._8_8_ = local_338;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) {
        local_338._8_8_ = local_208.field_2._8_8_;
      }
      else {
        aStack_350._8_8_ = local_208._M_dataplus._M_p;
      }
      local_338._1_7_ = local_208.field_2._M_allocated_capacity._1_7_;
      local_338[0] = local_208.field_2._M_local_buf[0];
      local_340._M_p = (pointer)local_208._M_string_length;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p._0_4_ = _S_red;
      local_290._M_string_length = 0;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      memset(local_328,0,0x90);
      local_290.field_2._M_allocated_capacity = (size_type)&local_290;
      local_270 = 0;
      local_268._M_allocated_capacity = (size_type)local_258;
      local_268._8_8_ = 0;
      local_258[0]._M_local_buf[0] = '\0';
      local_290.field_2._8_8_ = local_290.field_2._M_allocated_capacity;
      GetDyndepFilePath((string *)local_158,this,(string *)lang,config);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_328,(string *)local_158);
      if ((cmCustomCommand *)local_158._0_8_ != (cmCustomCommand *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(local_2e0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(p_Var22 + 2));
      WriteTargetDependInfo(this,(string *)lang,config);
      cmLocalNinjaGenerator::AppendTargetDepends
                (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 &local_2b0,config,fileConfig_01,DependOnTargetArtifact);
      pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      pcVar17 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar11 = (*(pcVar17->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[0x41])(pcVar17,fileConfig_01);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar12,(ostream *)CONCAT44(extraout_var_02,iVar11),(cmNinjaBuild *)local_368,0,
                 (bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_368);
      p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
    } while (p_Var22 != local_3b8);
  }
  pcVar12 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  iVar11 = (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0x41])(pcVar12,fileConfig_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(extraout_var_03,iVar11),"\n",1);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements(
  const std::string& config, const std::string& fileConfig,
  bool firstForConfig)
{
  this->GeneratorTarget->CheckCxxModuleStatus(config);

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetImplFileStream(fileConfig));
  this->GetImplFileStream(fileConfig)
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  {
    std::vector<cmSourceFile const*> customCommands;
    this->GeneratorTarget->GetCustomCommands(customCommands, config);
    for (cmSourceFile const* sf : customCommands) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      // Record the custom commands for this target. The container is used
      // in WriteObjectBuildStatement when called in a loop below.
      this->Configs[config].CustomCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");

    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      auto objectFileName = this->GetGlobalGenerator()->ExpandCFGIntDir(
        this->ConvertToNinjaPath(sf->GetFullPath()), config);
      if (!cmHasSuffix(objectFileName, pchExtension)) {
        this->Configs[config].Objects.push_back(objectFileName);
      }
    }
  }

  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Order-only phony target for ", this->GetTargetName());
    build.Outputs.push_back(this->OrderDependsTargetForTarget(config));

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, config, fileConfig,
      DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cm::append(orderOnlyDeps, this->Configs[config].ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    for (cmCustomCommand const* cc : this->Configs[config].CustomCommands) {
      cmCustomCommandGenerator ccg(*cc, config, this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      std::transform(ccoutputs.begin(), ccoutputs.end(),
                     std::back_inserter(orderOnlyDeps),
                     this->MapToNinjaPath());
      std::transform(ccbyproducts.begin(), ccbyproducts.end(),
                     std::back_inserter(orderOnlyDeps),
                     this->MapToNinjaPath());
    }

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      // Any path that always exists will work here.  It would be nice to
      // use just "." but that is not supported by Ninja < 1.7.
      std::string tgtDir = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);

    for (cmSourceFile const* sf : objectSources) {
      this->WriteObjectBuildStatement(sf, config, fileConfig, firstForConfig);
    }
  }

  for (auto const& langDDIFiles : this->Configs[config].DDIFiles) {
    std::string const& language = langDDIFiles.first;
    cmNinjaDeps const& ddiFiles = langDDIFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language, config));
    build.Outputs.push_back(this->GetDyndepFilePath(language, config));
    build.ExplicitDeps = ddiFiles;

    this->WriteTargetDependInfo(language, config);

    // Make sure dyndep files for all our dependencies have already
    // been generated so that the '<LANG>Modules.json' files they
    // produced as side-effects are available for us to read.
    // Ideally we should depend on the '<LANG>Modules.json' files
    // from our dependencies directly, but we don't know which of
    // our dependencies produces them.  Fixing this will require
    // refactoring the Ninja generator to generate targets in
    // dependency order so that we can collect the needed information.
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, build.OrderOnlyDeps, config, fileConfig,
      DependOnTargetArtifact);

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  this->GetImplFileStream(fileConfig) << "\n";
}